

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
testing::HasSubstr<std::__cxx11::string>
          (PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,testing *this,
          StringLike<std::__cxx11::basic_string<char>_> *substring)

{
  HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *impl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  testing *local_18;
  StringLike<std::__cxx11::basic_string<char>_> *substring_local;
  
  local_18 = this;
  substring_local = (StringLike<std::__cxx11::basic_string<char>_> *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_58,(string *)this);
  internal::
  HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::HasSubstrMatcher(&local_38,&local_58);
  MakePolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>
            (__return_storage_ptr__,(testing *)&local_38,impl);
  internal::
  HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~HasSubstrMatcher(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

PolymorphicMatcher<internal::HasSubstrMatcher<std::string>> HasSubstr(
    const internal::StringLike<T>& substring) {
  return MakePolymorphicMatcher(
      internal::HasSubstrMatcher<std::string>(std::string(substring)));
}